

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O0

void __thiscall xray_re::se_respawn::state_write(se_respawn *this,xr_packet *packet)

{
  xr_packet *pxVar1;
  size_type sVar2;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_30;
  xr_packet *local_18;
  xr_packet *packet_local;
  se_respawn *this_local;
  
  local_18 = packet;
  packet_local = (xr_packet *)this;
  cse_alife_smart_zone::state_write(&this->super_cse_alife_smart_zone,packet);
  pxVar1 = local_18;
  if ((this->super_cse_alife_smart_zone).super_cse_alife_space_restrictor.
      super_cse_alife_dynamic_object.super_cse_alife_object.super_cse_abstract.m_version < 0x76) {
    if ((this->super_cse_alife_smart_zone).super_cse_alife_space_restrictor.
        super_cse_alife_dynamic_object.super_cse_alife_object.super_cse_abstract.m_version != 0x65)
    {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x1b4,"virtual void xray_re::se_respawn::state_write(xr_packet &)");
    }
  }
  else {
    sVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&this->m_spawned_obj)
    ;
    (*pxVar1->_vptr_xr_packet[0x15])(pxVar1,sVar2);
    pxVar1 = local_18;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              (&local_30,&this->m_spawned_obj);
    (*pxVar1->_vptr_xr_packet[2])(pxVar1,&local_30);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(&local_30);
  }
  return;
}

Assistant:

void se_respawn::state_write(xr_packet& packet)
{
	cse_alife_smart_zone::state_write(packet);
	if (m_version >= CSE_VERSION_SOC) {
		packet.w_size_u8(m_spawned_obj.size());
		packet.w_seq(m_spawned_obj);
	} else if (m_version == CSE_VERSION_2215) {
		// se_respawn will be represented as smart_terrain, but we are
		// safe because xrAI won't read data beyond cse_alife_smart_zone.
	} else {
		xr_not_implemented();
	}
}